

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

EndTerm * new_end_term(Token *op,void *expr)

{
  Token *pTVar1;
  void *any;
  EndTerm *pEVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x18);
  pEVar2 = (EndTerm *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node((Token *)0x0,end_eval);
  pTVar1 = pTVar3->token;
  (pEVar2->node).eval = pTVar3->eval;
  (pEVar2->node).token = pTVar1;
  pEVar2->expr = expr;
  return pEVar2;
}

Assistant:

EndTerm *new_end_term(Token *op, void *expr) {
    EndTerm *term = new(EndTerm);
    term->node = tree_node_(NULL, eval_handler(end_eval));
    term->expr = expr;
    return term;
}